

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word Gia_LutComputeTruth6(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTruths)

{
  int iVar1;
  int *piVar2;
  word wVar3;
  word *pwVar4;
  long lVar5;
  
  iVar1 = Gia_ObjIsLut(p,iObj);
  if (iVar1 != 0) {
    Gia_ManIncrementTravId(p);
    pwVar4 = s_Truths6;
    lVar5 = 0;
    while( true ) {
      iVar1 = Gia_ObjLutSize(p,iObj);
      if (iVar1 <= lVar5) break;
      piVar2 = Gia_ObjLutFanins(p,iObj);
      iVar1 = piVar2[lVar5];
      Vec_WrdWriteEntry(vTruths,iVar1,*pwVar4);
      Gia_ObjSetTravIdCurrentId(p,iVar1);
      lVar5 = lVar5 + 1;
      pwVar4 = pwVar4 + 1;
    }
    wVar3 = Gia_LutComputeTruth6_rec(p,iObj,vTruths);
    return wVar3;
  }
  __assert_fail("Gia_ObjIsLut(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaTruth.c"
                ,0x79,"word Gia_LutComputeTruth6(Gia_Man_t *, int, Vec_Wrd_t *)");
}

Assistant:

word Gia_LutComputeTruth6( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTruths )
{
    int k, iFan;
    assert( Gia_ObjIsLut(p, iObj) );
    Gia_ManIncrementTravId( p );
    Gia_LutForEachFanin( p, iObj, iFan, k )
    {
        Vec_WrdWriteEntry( vTruths, iFan, s_Truths6[k] );
        Gia_ObjSetTravIdCurrentId( p, iFan );
    }
    return Gia_LutComputeTruth6_rec( p, iObj, vTruths );
}